

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

AActor * P_LinePickActor(AActor *t1,DAngle *angle,double distance,DAngle *pitch,
                        ActorFlags *actorMask,DWORD wallMask)

{
  player_t *ppVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ActorFlags local_144;
  DVector3 direction;
  Origin TData;
  DVector3 local_118;
  FTraceResults trace;
  
  dVar5 = FFastTrig::cos(&fasttrig,pitch->Degrees * 11930464.711111112 + 6755399441055744.0);
  dVar6 = FFastTrig::cos(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  dVar7 = FFastTrig::sin(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  dVar8 = FFastTrig::sin(&fasttrig,pitch->Degrees * 11930464.711111112 + 6755399441055744.0);
  direction.Z = -dVar8;
  ppVar1 = t1->player;
  if (ppVar1 == (player_t *)0x0) {
    local_118.Z = 8.0;
  }
  else {
    local_118.Z = ppVar1->mo->AttackZOffset * ppVar1->crouchfactor;
  }
  local_118.Z = (((t1->__Pos).Z + t1->Height * 0.5) - t1->Floorclip) + local_118.Z;
  TData.hitGhosts = true;
  TData.MThruSpecies = false;
  TData.ThruSpecies = false;
  TData.ThruActors = false;
  local_118.X = (t1->__Pos).X;
  local_118.Y = (t1->__Pos).Y;
  local_144 = (ActorFlags)actorMask->Value;
  direction.X = dVar6 * dVar5;
  direction.Y = dVar7 * dVar5;
  TData.Caller = t1;
  bVar2 = Trace(&local_118,(sector_t_conflict *)t1->Sector,&direction,distance,&local_144,wallMask,
                t1,&trace,9,CheckForActor,&TData);
  pAVar4 = (AActor *)0x0;
  if (trace.HitType == TRACE_HitActor) {
    pAVar4 = trace.Actor;
  }
  pAVar3 = (AActor *)0x0;
  if (bVar2) {
    pAVar3 = pAVar4;
  }
  return pAVar3;
}

Assistant:

AActor *P_LinePickActor(AActor *t1, DAngle angle, double distance, DAngle pitch, ActorFlags actorMask, DWORD wallMask) 
{
	DVector3 direction;
	double shootz;

	double pc = pitch.Cos();
	direction = { pc * angle.Cos(), pc * angle.Sin(), -pitch.Sin() };
	shootz = t1->Center() - t1->Floorclip;

	if (t1->player != NULL)
	{
		shootz += t1->player->mo->AttackZOffset * t1->player->crouchfactor;
	}
	else
	{
		shootz += 8;
	}

	FTraceResults trace;
	Origin TData;
	
	TData.Caller = t1;
	TData.hitGhosts = true;
	TData.MThruSpecies = false;
	TData.ThruActors = false;
	TData.ThruSpecies = false;
	
	if (Trace(t1->PosAtZ(shootz), t1->Sector, direction, distance,
		actorMask, wallMask, t1, trace, TRACE_NoSky | TRACE_PortalRestrict, CheckForActor, &TData))
	{
		if (trace.HitType == TRACE_HitActor)
		{
			return trace.Actor;
		}
	}

	return NULL;
}